

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functable.h
# Opt level: O1

void __thiscall ICM::FuncTable::insert(FuncTable *this,string *name,string *nameref)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  FuncTableUnit local_a8;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->keymap)._M_t,nameref);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->keymap)._M_t._M_impl.super__Rb_tree_header) {
    mVar3 = 0;
  }
  else {
    mVar3 = *(mapped_type *)(cVar1._M_node + 2);
  }
  if (mVar3 != 0) {
    this->count = this->count + 1;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.ST.root._M_t.
    super___uniq_ptr_impl<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_ICM::Function::SignTree::Node_*,_std::default_delete<ICM::Function::SignTree::Node>_>
    .super__Head_base<0UL,_ICM::Function::SignTree::Node_*,_false>._M_head_impl =
         (__uniq_ptr_data<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>,_true,_true>
          )(__uniq_ptr_impl<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>
            )0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.name.field_2._8_8_ = 0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.name._M_string_length = 0;
    local_a8.name.field_2._M_allocated_capacity = 0;
    local_a8.id = 0;
    local_a8.name._M_dataplus._M_p = (pointer)0x0;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FuncTableUnit::FuncTableUnit(&local_a8);
    std::vector<ICM::FuncTableUnit,_std::allocator<ICM::FuncTableUnit>_>::
    emplace_back<ICM::FuncTableUnit>(&this->data,&local_a8);
    if (local_a8.ST.funcdata.
        super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.ST.funcdata.
                      super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.ST.funcdata.
                            super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.ST.funcdata.
                            super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ::~vector(&local_a8.ST.level);
    std::
    unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>::
    ~unique_ptr(&local_a8.ST.root);
    std::vector<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>::~vector
              (&local_a8.func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.name._M_dataplus._M_p != &local_a8.name.field_2) {
      operator_delete(local_a8.name._M_dataplus._M_p,local_a8.name.field_2._M_allocated_capacity + 1
                     );
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->keymap,name);
    *pmVar2 = mVar3;
  }
  return;
}

Assistant:

void insert(const string &name, const string &nameref) {
			size_t id = find(nameref);
			if (id) {
				count++;
				data.push_back(Unit());
				keymap[name] = id;
			}
		}